

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArHosekSkyModel.c
# Opt level: O1

ArHosekSkyModelState *
arhosekskymodelstate_alloc_init
          (double solar_elevation,double atmospheric_turbidity,double ground_albedo)

{
  ArHosekSkyModelState *pAVar1;
  ArHosekSkyModelState *config;
  long lVar2;
  double dVar3;
  
  pAVar1 = (ArHosekSkyModelState *)malloc(0x440);
  pAVar1->solar_radius = 0.00445058959258554;
  pAVar1->turbidity = atmospheric_turbidity;
  pAVar1->albedo = ground_albedo;
  pAVar1->elevation = solar_elevation;
  lVar2 = 0;
  config = pAVar1;
  do {
    ArHosekSkyModel_CookConfiguration
              (*(ArHosekSkyModel_Dataset *)((long)datasets + lVar2),(double *)config,
               atmospheric_turbidity,ground_albedo,solar_elevation);
    dVar3 = ArHosekSkyModel_CookRadianceConfiguration
                      (*(ArHosekSkyModel_Radiance_Dataset *)((long)datasetsRad + lVar2),
                       atmospheric_turbidity,ground_albedo,solar_elevation);
    *(double *)((long)pAVar1->radiances + lVar2) = dVar3;
    *(undefined8 *)((long)pAVar1->emission_correction_factor_sun + lVar2) = 0x3ff0000000000000;
    *(undefined8 *)((long)pAVar1->emission_correction_factor_sky + lVar2) = 0x3ff0000000000000;
    lVar2 = lVar2 + 8;
    config = (ArHosekSkyModelState *)(config->configs + 1);
  } while (lVar2 != 0x58);
  return pAVar1;
}

Assistant:

ArHosekSkyModelState  * arhosekskymodelstate_alloc_init(
        const double  solar_elevation,
        const double  atmospheric_turbidity,
        const double  ground_albedo
        )
{
    ArHosekSkyModelState  * state = ALLOC(ArHosekSkyModelState);

    state->solar_radius = ( 0.51 DEGREES ) / 2.0;
    state->turbidity    = atmospheric_turbidity;
    state->albedo       = ground_albedo;
    state->elevation    = solar_elevation;

    unsigned int wl;
    for( wl = 0; wl < 11; ++wl )
    {
        ArHosekSkyModel_CookConfiguration(
            datasets[wl], 
            state->configs[wl], 
            atmospheric_turbidity, 
            ground_albedo, 
            solar_elevation
            );

        state->radiances[wl] = 
            ArHosekSkyModel_CookRadianceConfiguration(
                datasetsRad[wl],
                atmospheric_turbidity,
                ground_albedo,
                solar_elevation
                );

        state->emission_correction_factor_sun[wl] = 1.0;
        state->emission_correction_factor_sky[wl] = 1.0;
    }

    return state;
}